

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx512::SubGridMBIntersectorKPluecker<4,_4,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  undefined4 uVar7;
  undefined4 uVar8;
  ushort uVar9;
  ushort uVar10;
  uint uVar11;
  Geometry *pGVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  byte bVar23;
  long lVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 (*pauVar34) [16];
  size_t sVar35;
  RayHitK<4> *pRVar36;
  byte bVar37;
  int iVar38;
  AABBNodeMB4D *node1;
  ulong uVar39;
  long lVar40;
  uint uVar41;
  long lVar42;
  ulong uVar43;
  ulong uVar44;
  long lVar45;
  long lVar46;
  byte bVar47;
  uint uVar48;
  float fVar49;
  float fVar97;
  float fVar98;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  undefined1 auVar70 [16];
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  float fVar99;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  vint4 ai;
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  vint4 ai_2;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar112;
  vint4 bi;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar118;
  vint4 ai_6;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  vint4 bi_2;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  vint4 bi_7;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [64];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [64];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  RTCFilterFunctionNArguments args;
  vint4 bi_3;
  vfloat<4> dist;
  vint<4> itime;
  vfloat<4> ftime;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_13a9;
  undefined1 (*local_13a8) [16];
  long local_13a0;
  ulong local_1398;
  uint local_138c;
  uint local_1388;
  uint local_1384;
  ulong local_1380;
  ulong local_1378;
  int local_1370;
  int iStack_136c;
  int iStack_1368;
  int iStack_1364;
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined8 local_1340;
  undefined8 uStack_1338;
  long local_1328;
  ulong local_1320;
  ulong local_1318;
  ulong local_1310;
  ulong local_1308;
  ulong local_1300;
  ulong local_12f8;
  long local_12f0;
  ulong local_12e8;
  size_t local_12e0;
  RayHitK<4> *local_12d8;
  long local_12d0;
  long local_12c8;
  Scene *local_12c0;
  ulong local_12b8;
  RTCFilterFunctionNArguments local_12b0;
  undefined1 local_1280 [16];
  undefined1 local_1270 [16];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined1 local_1230 [8];
  float fStack_1228;
  float fStack_1224;
  undefined1 local_1220 [8];
  float fStack_1218;
  float fStack_1214;
  int local_1210;
  int iStack_120c;
  int iStack_1208;
  int iStack_1204;
  float local_1200;
  float fStack_11fc;
  float fStack_11f8;
  float fStack_11f4;
  float local_11f0;
  float fStack_11ec;
  float fStack_11e8;
  float fStack_11e4;
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [16];
  undefined1 local_11b0 [16];
  undefined1 local_11a0 [16];
  undefined1 local_1190 [16];
  undefined1 local_1180 [32];
  float local_1160;
  float fStack_115c;
  float fStack_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  float fStack_1144;
  undefined1 local_1140 [32];
  undefined1 *local_1120;
  uint local_1118;
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  float local_10a0 [4];
  float fStack_1090;
  float fStack_108c;
  float fStack_1088;
  uint uStack_1084;
  undefined1 local_1080 [32];
  float local_1060 [4];
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  uint uStack_1044;
  float local_1030;
  float fStack_102c;
  float fStack_1028;
  float fStack_1024;
  undefined1 local_1020 [16];
  undefined1 local_1010 [16];
  undefined1 local_1000 [16];
  undefined1 local_ff0 [16];
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined1 local_fd0 [16];
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  local_13a8 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  local_1240 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar155 = ZEXT1664(local_1240);
  local_1250 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar156 = ZEXT1664(local_1250);
  local_1260 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar157 = ZEXT1664(local_1260);
  fVar118 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fStack_11e4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fStack_11f4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1270 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar118 * 0.99999964)));
  auVar158 = ZEXT1664(local_1270);
  local_1280 = vbroadcastss_avx512vl(ZEXT416((uint)(fStack_11e4 * 0.99999964)));
  auVar159 = ZEXT1664(local_1280);
  fVar112 = fStack_11f4 * 0.99999964;
  local_1220._4_4_ = fVar112;
  local_1220._0_4_ = fVar112;
  fStack_1218 = fVar112;
  fStack_1214 = fVar112;
  auVar141 = ZEXT1664(_local_1220);
  fVar118 = fVar118 * 1.0000004;
  local_1230._4_4_ = fVar118;
  local_1230._0_4_ = fVar118;
  fStack_1228 = fVar118;
  fStack_1224 = fVar118;
  auVar137 = ZEXT1664(_local_1230);
  fStack_11e4 = fStack_11e4 * 1.0000004;
  fStack_11f4 = fStack_11f4 * 1.0000004;
  local_12f8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1300 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_1308 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1310 = local_12f8 ^ 0x10;
  local_1318 = local_1300 ^ 0x10;
  local_1320 = local_1308 ^ 0x10;
  iStack_1204 = (tray->tnear).field_0.i[k];
  iStack_1364 = (tray->tfar).field_0.i[k];
  local_11c0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  fStack_11e8 = fStack_11e4;
  fStack_11ec = fStack_11e4;
  local_11f0 = fStack_11e4;
  fStack_11f8 = fStack_11f4;
  fStack_11fc = fStack_11f4;
  local_1200 = fStack_11f4;
  iStack_1208 = iStack_1204;
  iStack_120c = iStack_1204;
  local_1210 = iStack_1204;
  local_12d8 = ray;
  local_12e0 = k;
  iStack_1368 = iStack_1364;
  iStack_136c = iStack_1364;
  local_1370 = iStack_1364;
  do {
    do {
      do {
        if (local_13a8 == (undefined1 (*) [16])&local_fa0) {
          return;
        }
        pauVar34 = local_13a8 + -1;
        local_13a8 = local_13a8 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < *(float *)((long)*pauVar34 + 8));
      local_1380 = *(ulong *)*local_13a8;
      do {
        if ((local_1380 & 8) == 0) {
          uVar39 = local_1380 & 0xfffffffffffffff0;
          uVar7 = *(undefined4 *)(ray + k * 4 + 0x70);
          auVar61._4_4_ = uVar7;
          auVar61._0_4_ = uVar7;
          auVar61._8_4_ = uVar7;
          auVar61._12_4_ = uVar7;
          auVar52 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0x80 + local_12f8),auVar61,
                                    *(undefined1 (*) [16])(uVar39 + 0x20 + local_12f8));
          auVar50 = vsubps_avx512vl(auVar52,auVar155._0_16_);
          auVar52 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0x80 + local_1300),auVar61,
                                    *(undefined1 (*) [16])(uVar39 + 0x20 + local_1300));
          auVar51 = vmulps_avx512vl(auVar158._0_16_,auVar50);
          auVar50 = vsubps_avx512vl(auVar52,auVar156._0_16_);
          auVar52 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0x80 + local_1308),auVar61,
                                    *(undefined1 (*) [16])(uVar39 + 0x20 + local_1308));
          auVar50 = vmulps_avx512vl(auVar159._0_16_,auVar50);
          auVar52 = vsubps_avx512vl(auVar52,auVar157._0_16_);
          auVar119._0_4_ = auVar141._0_4_ * auVar52._0_4_;
          auVar119._4_4_ = auVar141._4_4_ * auVar52._4_4_;
          auVar119._8_4_ = auVar141._8_4_ * auVar52._8_4_;
          auVar119._12_4_ = auVar141._12_4_ * auVar52._12_4_;
          auVar52 = vmaxps_avx(auVar50,auVar119);
          auVar50._4_4_ = iStack_120c;
          auVar50._0_4_ = local_1210;
          auVar50._8_4_ = iStack_1208;
          auVar50._12_4_ = iStack_1204;
          auVar50 = vmaxps_avx(auVar50,auVar51);
          auVar52 = vmaxps_avx(auVar50,auVar52);
          auVar50 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0x80 + local_1310),auVar61,
                                    *(undefined1 (*) [16])(uVar39 + 0x20 + local_1310));
          auVar50 = vsubps_avx512vl(auVar50,auVar155._0_16_);
          auVar113._0_4_ = auVar137._0_4_ * auVar50._0_4_;
          auVar113._4_4_ = auVar137._4_4_ * auVar50._4_4_;
          auVar113._8_4_ = auVar137._8_4_ * auVar50._8_4_;
          auVar113._12_4_ = auVar137._12_4_ * auVar50._12_4_;
          auVar50 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0x80 + local_1318),auVar61,
                                    *(undefined1 (*) [16])(uVar39 + 0x20 + local_1318));
          auVar50 = vsubps_avx512vl(auVar50,auVar156._0_16_);
          auVar60._0_4_ = auVar50._0_4_ * local_11f0;
          auVar60._4_4_ = auVar50._4_4_ * fStack_11ec;
          auVar60._8_4_ = auVar50._8_4_ * fStack_11e8;
          auVar60._12_4_ = auVar50._12_4_ * fStack_11e4;
          auVar50 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0x80 + local_1320),auVar61,
                                    *(undefined1 (*) [16])(uVar39 + 0x20 + local_1320));
          auVar50 = vsubps_avx512vl(auVar50,auVar157._0_16_);
          auVar126._0_4_ = auVar50._0_4_ * local_1200;
          auVar126._4_4_ = auVar50._4_4_ * fStack_11fc;
          auVar126._8_4_ = auVar50._8_4_ * fStack_11f8;
          auVar126._12_4_ = auVar50._12_4_ * fStack_11f4;
          auVar50 = vminps_avx(auVar60,auVar126);
          auVar51._4_4_ = iStack_136c;
          auVar51._0_4_ = local_1370;
          auVar51._8_4_ = iStack_1368;
          auVar51._12_4_ = iStack_1364;
          auVar51 = vminps_avx(auVar51,auVar113);
          auVar50 = vminps_avx(auVar51,auVar50);
          uVar21 = vcmpps_avx512vl(auVar52,auVar50,2);
          bVar47 = (byte)uVar21;
          if (((uint)local_1380 & 7) == 6) {
            uVar21 = vcmpps_avx512vl(auVar61,*(undefined1 (*) [16])(uVar39 + 0xf0),1);
            uVar22 = vcmpps_avx512vl(auVar61,*(undefined1 (*) [16])(uVar39 + 0xe0),0xd);
            bVar47 = (byte)uVar21 & (byte)uVar22 & bVar47;
          }
          local_12e8 = CONCAT44((int)(uVar39 >> 0x20),(uint)bVar47);
          local_1180._0_16_ = auVar52;
        }
        if ((local_1380 & 8) == 0) {
          if (local_12e8 == 0) {
            iVar38 = 4;
          }
          else {
            uVar43 = local_1380 & 0xfffffffffffffff0;
            lVar24 = 0;
            for (uVar39 = local_12e8; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000)
            {
              lVar24 = lVar24 + 1;
            }
            iVar38 = 0;
            uVar39 = local_12e8 - 1 & local_12e8;
            local_1380 = *(ulong *)(uVar43 + lVar24 * 8);
            if (uVar39 != 0) {
              uVar48 = *(uint *)(local_1180 + lVar24 * 4);
              lVar24 = 0;
              for (uVar44 = uVar39; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
                lVar24 = lVar24 + 1;
              }
              uVar39 = uVar39 - 1 & uVar39;
              uVar44 = *(ulong *)(uVar43 + lVar24 * 8);
              uVar11 = *(uint *)(local_1180 + lVar24 * 4);
              if (uVar39 == 0) {
                if (uVar48 < uVar11) {
                  *(ulong *)*local_13a8 = uVar44;
                  *(uint *)((long)*local_13a8 + 8) = uVar11;
                  local_13a8 = local_13a8 + 1;
                }
                else {
                  *(ulong *)*local_13a8 = local_1380;
                  *(uint *)((long)*local_13a8 + 8) = uVar48;
                  local_1380 = uVar44;
                  local_13a8 = local_13a8 + 1;
                }
              }
              else {
                auVar52._8_8_ = 0;
                auVar52._0_8_ = local_1380;
                auVar52 = vpunpcklqdq_avx(auVar52,ZEXT416(uVar48));
                auVar70._8_8_ = 0;
                auVar70._0_8_ = uVar44;
                auVar50 = vpunpcklqdq_avx(auVar70,ZEXT416(uVar11));
                lVar24 = 0;
                for (uVar44 = uVar39; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000)
                {
                  lVar24 = lVar24 + 1;
                }
                uVar39 = uVar39 - 1 & uVar39;
                auVar63._8_8_ = 0;
                auVar63._0_8_ = *(ulong *)(uVar43 + lVar24 * 8);
                auVar119 = vpunpcklqdq_avx(auVar63,ZEXT416(*(uint *)(local_1180 + lVar24 * 4)));
                auVar51 = vpshufd_avx(auVar52,0xaa);
                auVar61 = vpshufd_avx(auVar50,0xaa);
                auVar113 = vpshufd_avx(auVar119,0xaa);
                if (uVar39 == 0) {
                  uVar39 = vpcmpgtd_avx512vl(auVar61,auVar51);
                  uVar39 = uVar39 & 0xf;
                  auVar61 = vpblendmd_avx512vl(auVar50,auVar52);
                  bVar20 = (bool)((byte)uVar39 & 1);
                  auVar53._0_4_ = (uint)bVar20 * auVar61._0_4_ | (uint)!bVar20 * auVar51._0_4_;
                  bVar20 = (bool)((byte)(uVar39 >> 1) & 1);
                  auVar53._4_4_ = (uint)bVar20 * auVar61._4_4_ | (uint)!bVar20 * auVar51._4_4_;
                  bVar20 = (bool)((byte)(uVar39 >> 2) & 1);
                  auVar53._8_4_ = (uint)bVar20 * auVar61._8_4_ | (uint)!bVar20 * auVar51._8_4_;
                  bVar20 = SUB81(uVar39 >> 3,0);
                  auVar53._12_4_ = (uint)bVar20 * auVar61._12_4_ | (uint)!bVar20 * auVar51._12_4_;
                  auVar50 = vmovdqa32_avx512vl(auVar50);
                  bVar20 = (bool)((byte)uVar39 & 1);
                  auVar54._0_4_ = (uint)bVar20 * auVar50._0_4_ | (uint)!bVar20 * auVar52._0_4_;
                  bVar20 = (bool)((byte)(uVar39 >> 1) & 1);
                  auVar54._4_4_ = (uint)bVar20 * auVar50._4_4_ | (uint)!bVar20 * auVar52._4_4_;
                  bVar20 = (bool)((byte)(uVar39 >> 2) & 1);
                  auVar54._8_4_ = (uint)bVar20 * auVar50._8_4_ | (uint)!bVar20 * auVar52._8_4_;
                  bVar20 = SUB81(uVar39 >> 3,0);
                  auVar54._12_4_ = (uint)bVar20 * auVar50._12_4_ | (uint)!bVar20 * auVar52._12_4_;
                  auVar52 = vpshufd_avx(auVar53,0xaa);
                  uVar39 = vpcmpgtd_avx512vl(auVar113,auVar52);
                  uVar39 = uVar39 & 0xf;
                  auVar50 = vpblendmd_avx512vl(auVar119,auVar53);
                  bVar20 = (bool)((byte)uVar39 & 1);
                  bVar18 = (bool)((byte)(uVar39 >> 1) & 1);
                  local_1380 = CONCAT44((uint)bVar18 * auVar50._4_4_ | (uint)!bVar18 * auVar52._4_4_
                                        ,(uint)bVar20 * auVar50._0_4_ |
                                         (uint)!bVar20 * auVar52._0_4_);
                  auVar52 = vmovdqa32_avx512vl(auVar119);
                  bVar20 = (bool)((byte)uVar39 & 1);
                  auVar55._0_4_ = (uint)bVar20 * auVar52._0_4_ | !bVar20 * auVar53._0_4_;
                  bVar20 = (bool)((byte)(uVar39 >> 1) & 1);
                  auVar55._4_4_ = (uint)bVar20 * auVar52._4_4_ | !bVar20 * auVar53._4_4_;
                  bVar20 = (bool)((byte)(uVar39 >> 2) & 1);
                  auVar55._8_4_ = (uint)bVar20 * auVar52._8_4_ | !bVar20 * auVar53._8_4_;
                  bVar20 = SUB81(uVar39 >> 3,0);
                  auVar55._12_4_ = (uint)bVar20 * auVar52._12_4_ | !bVar20 * auVar53._12_4_;
                  auVar52 = vpshufd_avx(auVar55,0xaa);
                  auVar50 = vpshufd_avx(auVar54,0xaa);
                  uVar39 = vpcmpgtd_avx512vl(auVar52,auVar50);
                  uVar39 = uVar39 & 0xf;
                  auVar50 = vpblendmd_avx512vl(auVar55,auVar54);
                  bVar20 = (bool)((byte)uVar39 & 1);
                  auVar56._0_4_ = (uint)bVar20 * auVar50._0_4_ | (uint)!bVar20 * auVar52._0_4_;
                  bVar20 = (bool)((byte)(uVar39 >> 1) & 1);
                  auVar56._4_4_ = (uint)bVar20 * auVar50._4_4_ | (uint)!bVar20 * auVar52._4_4_;
                  bVar20 = (bool)((byte)(uVar39 >> 2) & 1);
                  auVar56._8_4_ = (uint)bVar20 * auVar50._8_4_ | (uint)!bVar20 * auVar52._8_4_;
                  bVar20 = SUB81(uVar39 >> 3,0);
                  auVar56._12_4_ = (uint)bVar20 * auVar50._12_4_ | (uint)!bVar20 * auVar52._12_4_;
                  auVar52 = vmovdqa32_avx512vl(auVar55);
                  bVar20 = (bool)((byte)uVar39 & 1);
                  auVar57._0_4_ = (uint)bVar20 * auVar52._0_4_ | !bVar20 * auVar54._0_4_;
                  bVar20 = (bool)((byte)(uVar39 >> 1) & 1);
                  auVar57._4_4_ = (uint)bVar20 * auVar52._4_4_ | !bVar20 * auVar54._4_4_;
                  bVar20 = (bool)((byte)(uVar39 >> 2) & 1);
                  auVar57._8_4_ = (uint)bVar20 * auVar52._8_4_ | !bVar20 * auVar54._8_4_;
                  bVar20 = SUB81(uVar39 >> 3,0);
                  auVar57._12_4_ = (uint)bVar20 * auVar52._12_4_ | !bVar20 * auVar54._12_4_;
                  *local_13a8 = auVar57;
                  local_13a8[1] = auVar56;
                  local_13a8 = local_13a8 + 2;
                }
                else {
                  lVar24 = 0;
                  for (; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
                    lVar24 = lVar24 + 1;
                  }
                  uVar48 = *(uint *)(local_1180 + lVar24 * 4);
                  auVar138._8_8_ = 0;
                  auVar138._0_8_ = *(ulong *)(uVar43 + lVar24 * 8);
                  auVar60 = vpunpcklqdq_avx(auVar138,ZEXT416(uVar48));
                  uVar39 = vpcmpgtd_avx512vl(auVar61,auVar51);
                  uVar39 = uVar39 & 0xf;
                  auVar61 = vpblendmd_avx512vl(auVar50,auVar52);
                  bVar20 = (bool)((byte)uVar39 & 1);
                  auVar62._0_4_ = (uint)bVar20 * auVar61._0_4_ | (uint)!bVar20 * auVar51._0_4_;
                  bVar20 = (bool)((byte)(uVar39 >> 1) & 1);
                  auVar62._4_4_ = (uint)bVar20 * auVar61._4_4_ | (uint)!bVar20 * auVar51._4_4_;
                  bVar20 = (bool)((byte)(uVar39 >> 2) & 1);
                  auVar62._8_4_ = (uint)bVar20 * auVar61._8_4_ | (uint)!bVar20 * auVar51._8_4_;
                  bVar20 = SUB81(uVar39 >> 3,0);
                  auVar62._12_4_ = (uint)bVar20 * auVar61._12_4_ | (uint)!bVar20 * auVar51._12_4_;
                  auVar50 = vmovdqa32_avx512vl(auVar50);
                  bVar20 = (bool)((byte)uVar39 & 1);
                  auVar64._0_4_ = (uint)bVar20 * auVar50._0_4_ | (uint)!bVar20 * auVar52._0_4_;
                  bVar20 = (bool)((byte)(uVar39 >> 1) & 1);
                  auVar64._4_4_ = (uint)bVar20 * auVar50._4_4_ | (uint)!bVar20 * auVar52._4_4_;
                  bVar20 = (bool)((byte)(uVar39 >> 2) & 1);
                  auVar64._8_4_ = (uint)bVar20 * auVar50._8_4_ | (uint)!bVar20 * auVar52._8_4_;
                  bVar20 = SUB81(uVar39 >> 3,0);
                  auVar64._12_4_ = (uint)bVar20 * auVar50._12_4_ | (uint)!bVar20 * auVar52._12_4_;
                  auVar114._4_4_ = uVar48;
                  auVar114._0_4_ = uVar48;
                  auVar114._8_4_ = uVar48;
                  auVar114._12_4_ = uVar48;
                  uVar39 = vpcmpgtd_avx512vl(auVar114,auVar113);
                  uVar39 = uVar39 & 0xf;
                  auVar52 = vpblendmd_avx512vl(auVar60,auVar119);
                  bVar20 = (bool)((byte)uVar39 & 1);
                  auVar65._0_4_ = (uint)bVar20 * auVar52._0_4_ | !bVar20 * uVar48;
                  bVar20 = (bool)((byte)(uVar39 >> 1) & 1);
                  auVar65._4_4_ = (uint)bVar20 * auVar52._4_4_ | !bVar20 * uVar48;
                  bVar20 = (bool)((byte)(uVar39 >> 2) & 1);
                  auVar65._8_4_ = (uint)bVar20 * auVar52._8_4_ | !bVar20 * uVar48;
                  bVar20 = SUB81(uVar39 >> 3,0);
                  auVar65._12_4_ = (uint)bVar20 * auVar52._12_4_ | !bVar20 * uVar48;
                  auVar52 = vmovdqa32_avx512vl(auVar60);
                  bVar20 = (bool)((byte)uVar39 & 1);
                  auVar66._0_4_ = (uint)bVar20 * auVar52._0_4_ | (uint)!bVar20 * auVar119._0_4_;
                  bVar20 = (bool)((byte)(uVar39 >> 1) & 1);
                  auVar66._4_4_ = (uint)bVar20 * auVar52._4_4_ | (uint)!bVar20 * auVar119._4_4_;
                  bVar20 = (bool)((byte)(uVar39 >> 2) & 1);
                  auVar66._8_4_ = (uint)bVar20 * auVar52._8_4_ | (uint)!bVar20 * auVar119._8_4_;
                  bVar20 = SUB81(uVar39 >> 3,0);
                  auVar66._12_4_ = (uint)bVar20 * auVar52._12_4_ | (uint)!bVar20 * auVar119._12_4_;
                  auVar141 = ZEXT1664(auVar141._0_16_);
                  auVar52 = vpshufd_avx(auVar66,0xaa);
                  auVar50 = vpshufd_avx(auVar64,0xaa);
                  uVar39 = vpcmpgtd_avx512vl(auVar52,auVar50);
                  uVar39 = uVar39 & 0xf;
                  auVar50 = vpblendmd_avx512vl(auVar66,auVar64);
                  bVar20 = (bool)((byte)uVar39 & 1);
                  auVar67._0_4_ = (uint)bVar20 * auVar50._0_4_ | (uint)!bVar20 * auVar52._0_4_;
                  bVar20 = (bool)((byte)(uVar39 >> 1) & 1);
                  auVar67._4_4_ = (uint)bVar20 * auVar50._4_4_ | (uint)!bVar20 * auVar52._4_4_;
                  bVar20 = (bool)((byte)(uVar39 >> 2) & 1);
                  auVar67._8_4_ = (uint)bVar20 * auVar50._8_4_ | (uint)!bVar20 * auVar52._8_4_;
                  bVar20 = SUB81(uVar39 >> 3,0);
                  auVar67._12_4_ = (uint)bVar20 * auVar50._12_4_ | (uint)!bVar20 * auVar52._12_4_;
                  auVar52 = vmovdqa32_avx512vl(auVar66);
                  bVar20 = (bool)((byte)uVar39 & 1);
                  auVar68._0_4_ = (uint)bVar20 * auVar52._0_4_ | !bVar20 * auVar64._0_4_;
                  bVar20 = (bool)((byte)(uVar39 >> 1) & 1);
                  auVar68._4_4_ = (uint)bVar20 * auVar52._4_4_ | !bVar20 * auVar64._4_4_;
                  bVar20 = (bool)((byte)(uVar39 >> 2) & 1);
                  auVar68._8_4_ = (uint)bVar20 * auVar52._8_4_ | !bVar20 * auVar64._8_4_;
                  bVar20 = SUB81(uVar39 >> 3,0);
                  auVar68._12_4_ = (uint)bVar20 * auVar52._12_4_ | !bVar20 * auVar64._12_4_;
                  auVar52 = vpshufd_avx(auVar65,0xaa);
                  auVar50 = vpshufd_avx(auVar62,0xaa);
                  uVar39 = vpcmpgtd_avx512vl(auVar52,auVar50);
                  uVar39 = uVar39 & 0xf;
                  auVar50 = vpblendmd_avx512vl(auVar65,auVar62);
                  bVar20 = (bool)((byte)uVar39 & 1);
                  bVar18 = (bool)((byte)(uVar39 >> 1) & 1);
                  local_1380 = CONCAT44((uint)bVar18 * auVar50._4_4_ | (uint)!bVar18 * auVar52._4_4_
                                        ,(uint)bVar20 * auVar50._0_4_ |
                                         (uint)!bVar20 * auVar52._0_4_);
                  auVar52 = vmovdqa32_avx512vl(auVar65);
                  bVar20 = (bool)((byte)uVar39 & 1);
                  auVar69._0_4_ = (uint)bVar20 * auVar52._0_4_ | !bVar20 * auVar62._0_4_;
                  bVar20 = (bool)((byte)(uVar39 >> 1) & 1);
                  auVar69._4_4_ = (uint)bVar20 * auVar52._4_4_ | !bVar20 * auVar62._4_4_;
                  bVar20 = (bool)((byte)(uVar39 >> 2) & 1);
                  auVar69._8_4_ = (uint)bVar20 * auVar52._8_4_ | !bVar20 * auVar62._8_4_;
                  bVar20 = SUB81(uVar39 >> 3,0);
                  auVar69._12_4_ = (uint)bVar20 * auVar52._12_4_ | !bVar20 * auVar62._12_4_;
                  auVar52 = vpshufd_avx(auVar69,0xaa);
                  auVar50 = vpshufd_avx(auVar67,0xaa);
                  uVar39 = vpcmpgtd_avx512vl(auVar50,auVar52);
                  uVar39 = uVar39 & 0xf;
                  auVar50 = vpblendmd_avx512vl(auVar67,auVar69);
                  bVar20 = (bool)((byte)uVar39 & 1);
                  auVar58._0_4_ = (uint)bVar20 * auVar50._0_4_ | (uint)!bVar20 * auVar52._0_4_;
                  bVar20 = (bool)((byte)(uVar39 >> 1) & 1);
                  auVar58._4_4_ = (uint)bVar20 * auVar50._4_4_ | (uint)!bVar20 * auVar52._4_4_;
                  bVar20 = (bool)((byte)(uVar39 >> 2) & 1);
                  auVar58._8_4_ = (uint)bVar20 * auVar50._8_4_ | (uint)!bVar20 * auVar52._8_4_;
                  bVar20 = SUB81(uVar39 >> 3,0);
                  auVar58._12_4_ = (uint)bVar20 * auVar50._12_4_ | (uint)!bVar20 * auVar52._12_4_;
                  auVar52 = vmovdqa32_avx512vl(auVar67);
                  bVar20 = (bool)((byte)uVar39 & 1);
                  auVar59._0_4_ = (uint)bVar20 * auVar52._0_4_ | !bVar20 * auVar69._0_4_;
                  bVar20 = (bool)((byte)(uVar39 >> 1) & 1);
                  auVar59._4_4_ = (uint)bVar20 * auVar52._4_4_ | !bVar20 * auVar69._4_4_;
                  bVar20 = (bool)((byte)(uVar39 >> 2) & 1);
                  auVar59._8_4_ = (uint)bVar20 * auVar52._8_4_ | !bVar20 * auVar69._8_4_;
                  bVar20 = SUB81(uVar39 >> 3,0);
                  auVar59._12_4_ = (uint)bVar20 * auVar52._12_4_ | !bVar20 * auVar69._12_4_;
                  *local_13a8 = auVar68;
                  local_13a8[1] = auVar59;
                  local_13a8[2] = auVar58;
                  local_13a8 = local_13a8 + 3;
                }
                auVar137 = ZEXT1664(auVar137._0_16_);
              }
            }
          }
        }
        else {
          iVar38 = 6;
        }
      } while (iVar38 == 0);
    } while (iVar38 != 6);
    local_1328 = (ulong)((uint)local_1380 & 0xf) - 8;
    if (local_1328 != 0) {
      local_1380 = local_1380 & 0xfffffffffffffff0;
      local_12f0 = 0;
      do {
        local_13a0 = local_12f0 * 0x90;
        fVar118 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(local_1380 + 0x80 + local_13a0)) *
                  *(float *)(local_1380 + 0x84 + local_13a0);
        auVar107._8_8_ = 0;
        auVar107._0_8_ = *(ulong *)(local_1380 + 0x20 + local_13a0);
        auVar115._8_8_ = 0;
        auVar115._0_8_ = *(ulong *)(local_1380 + 0x24 + local_13a0);
        uVar21 = vpcmpub_avx512vl(auVar107,auVar115,2);
        auVar52 = vpmovzxbd_avx(auVar107);
        auVar52 = vcvtdq2ps_avx(auVar52);
        uVar7 = *(undefined4 *)(local_1380 + 0x44 + local_13a0);
        auVar127._4_4_ = uVar7;
        auVar127._0_4_ = uVar7;
        auVar127._8_4_ = uVar7;
        auVar127._12_4_ = uVar7;
        uVar7 = *(undefined4 *)(local_1380 + 0x38 + local_13a0);
        auVar132._4_4_ = uVar7;
        auVar132._0_4_ = uVar7;
        auVar132._8_4_ = uVar7;
        auVar132._12_4_ = uVar7;
        auVar50 = vfmadd213ps_fma(auVar52,auVar127,auVar132);
        auVar108._8_8_ = 0;
        auVar108._0_8_ = *(ulong *)(local_1380 + 0x50 + local_13a0);
        auVar52 = vpmovzxbd_avx(auVar108);
        auVar52 = vcvtdq2ps_avx(auVar52);
        uVar7 = *(undefined4 *)(local_1380 + 0x74 + local_13a0);
        auVar139._4_4_ = uVar7;
        auVar139._0_4_ = uVar7;
        auVar139._8_4_ = uVar7;
        auVar139._12_4_ = uVar7;
        uVar7 = *(undefined4 *)(local_1380 + 0x68 + local_13a0);
        auVar142._4_4_ = uVar7;
        auVar142._0_4_ = uVar7;
        auVar142._8_4_ = uVar7;
        auVar142._12_4_ = uVar7;
        auVar52 = vfmadd213ps_fma(auVar52,auVar139,auVar142);
        auVar103._4_4_ = fVar118;
        auVar103._0_4_ = fVar118;
        auVar103._8_4_ = fVar118;
        auVar103._12_4_ = fVar118;
        auVar52 = vsubps_avx(auVar52,auVar50);
        auVar50 = vfmadd213ps_fma(auVar52,auVar103,auVar50);
        auVar52 = vpmovzxbd_avx(auVar115);
        auVar52 = vcvtdq2ps_avx(auVar52);
        auVar51 = vfmadd213ps_fma(auVar52,auVar127,auVar132);
        auVar116._8_8_ = 0;
        auVar116._0_8_ = *(ulong *)(local_1380 + 0x54 + local_13a0);
        auVar52 = vpmovzxbd_avx(auVar116);
        auVar52 = vcvtdq2ps_avx(auVar52);
        auVar52 = vfmadd213ps_fma(auVar52,auVar139,auVar142);
        auVar52 = vsubps_avx(auVar52,auVar51);
        auVar51 = vfmadd213ps_fma(auVar52,auVar103,auVar51);
        auVar120._8_8_ = 0;
        auVar120._0_8_ = *(ulong *)(local_1380 + 0x28 + local_13a0);
        auVar52 = vpmovzxbd_avx(auVar120);
        auVar52 = vcvtdq2ps_avx(auVar52);
        uVar7 = *(undefined4 *)(local_1380 + 0x48 + local_13a0);
        auVar128._4_4_ = uVar7;
        auVar128._0_4_ = uVar7;
        auVar128._8_4_ = uVar7;
        auVar128._12_4_ = uVar7;
        uVar7 = *(undefined4 *)(local_1380 + 0x3c + local_13a0);
        auVar133._4_4_ = uVar7;
        auVar133._0_4_ = uVar7;
        auVar133._8_4_ = uVar7;
        auVar133._12_4_ = uVar7;
        auVar61 = vfmadd213ps_fma(auVar52,auVar128,auVar133);
        auVar140._8_8_ = 0;
        auVar140._0_8_ = *(ulong *)(local_1380 + 0x58 + local_13a0);
        auVar52 = vpmovzxbd_avx(auVar140);
        uVar7 = *(undefined4 *)(local_1380 + 0x78 + local_13a0);
        auVar143._4_4_ = uVar7;
        auVar143._0_4_ = uVar7;
        auVar143._8_4_ = uVar7;
        auVar143._12_4_ = uVar7;
        auVar52 = vcvtdq2ps_avx(auVar52);
        uVar7 = *(undefined4 *)(local_1380 + 0x6c + local_13a0);
        auVar147._4_4_ = uVar7;
        auVar147._0_4_ = uVar7;
        auVar147._8_4_ = uVar7;
        auVar147._12_4_ = uVar7;
        auVar52 = vfmadd213ps_fma(auVar52,auVar143,auVar147);
        auVar52 = vsubps_avx(auVar52,auVar61);
        auVar61 = vfmadd213ps_fma(auVar52,auVar103,auVar61);
        auVar121._8_8_ = 0;
        auVar121._0_8_ = *(ulong *)(local_1380 + 0x2c + local_13a0);
        auVar52 = vpmovzxbd_avx(auVar121);
        auVar52 = vcvtdq2ps_avx(auVar52);
        auVar113 = vfmadd213ps_fma(auVar52,auVar128,auVar133);
        auVar149._8_8_ = 0;
        auVar149._0_8_ = *(ulong *)(local_1380 + 0x5c + local_13a0);
        auVar52 = vpmovzxbd_avx(auVar149);
        auVar52 = vcvtdq2ps_avx(auVar52);
        auVar52 = vfmadd213ps_fma(auVar52,auVar143,auVar147);
        auVar52 = vsubps_avx(auVar52,auVar113);
        auVar113 = vfmadd213ps_fma(auVar52,auVar103,auVar113);
        auVar122._8_8_ = 0;
        auVar122._0_8_ = *(ulong *)(local_1380 + 0x30 + local_13a0);
        auVar52 = vpmovzxbd_avx(auVar122);
        auVar52 = vcvtdq2ps_avx(auVar52);
        uVar7 = *(undefined4 *)(local_1380 + 0x4c + local_13a0);
        auVar134._4_4_ = uVar7;
        auVar134._0_4_ = uVar7;
        auVar134._8_4_ = uVar7;
        auVar134._12_4_ = uVar7;
        uVar7 = *(undefined4 *)(local_1380 + 0x40 + local_13a0);
        auVar144._4_4_ = uVar7;
        auVar144._0_4_ = uVar7;
        auVar144._8_4_ = uVar7;
        auVar144._12_4_ = uVar7;
        auVar119 = vfmadd213ps_fma(auVar52,auVar134,auVar144);
        auVar148._8_8_ = 0;
        auVar148._0_8_ = *(ulong *)(local_1380 + 0x60 + local_13a0);
        auVar52 = vpmovzxbd_avx(auVar148);
        auVar52 = vcvtdq2ps_avx(auVar52);
        uVar7 = *(undefined4 *)(local_1380 + 0x7c + local_13a0);
        auVar150._4_4_ = uVar7;
        auVar150._0_4_ = uVar7;
        auVar150._8_4_ = uVar7;
        auVar150._12_4_ = uVar7;
        uVar7 = *(undefined4 *)(local_1380 + 0x70 + local_13a0);
        auVar151._4_4_ = uVar7;
        auVar151._0_4_ = uVar7;
        auVar151._8_4_ = uVar7;
        auVar151._12_4_ = uVar7;
        auVar52 = vfmadd213ps_fma(auVar52,auVar150,auVar151);
        auVar52 = vsubps_avx(auVar52,auVar119);
        auVar119 = vfmadd213ps_fma(auVar52,auVar103,auVar119);
        auVar123._8_8_ = 0;
        auVar123._0_8_ = *(ulong *)(local_1380 + 0x34 + local_13a0);
        auVar52 = vpmovzxbd_avx(auVar123);
        auVar52 = vcvtdq2ps_avx(auVar52);
        auVar60 = vfmadd213ps_fma(auVar52,auVar134,auVar144);
        auVar135._8_8_ = 0;
        auVar135._0_8_ = *(ulong *)(local_1380 + 100 + local_13a0);
        auVar52 = vpmovzxbd_avx(auVar135);
        auVar52 = vcvtdq2ps_avx(auVar52);
        auVar52 = vfmadd213ps_fma(auVar52,auVar150,auVar151);
        auVar52 = vsubps_avx(auVar52,auVar60);
        auVar52 = vfmadd213ps_fma(auVar52,auVar103,auVar60);
        auVar50 = vsubps_avx512vl(auVar50,auVar155._0_16_);
        auVar60 = vmulps_avx512vl(auVar158._0_16_,auVar50);
        auVar50 = vsubps_avx512vl(auVar61,auVar156._0_16_);
        auVar61 = vmulps_avx512vl(auVar159._0_16_,auVar50);
        auVar50 = vsubps_avx512vl(auVar119,auVar157._0_16_);
        auVar124._0_4_ = auVar50._0_4_ * (float)local_1220._0_4_;
        auVar124._4_4_ = auVar50._4_4_ * (float)local_1220._4_4_;
        auVar124._8_4_ = auVar50._8_4_ * fStack_1218;
        auVar124._12_4_ = auVar50._12_4_ * fStack_1214;
        auVar50 = vsubps_avx512vl(auVar51,auVar155._0_16_);
        auVar117._0_4_ = auVar50._0_4_ * (float)local_1230._0_4_;
        auVar117._4_4_ = auVar50._4_4_ * (float)local_1230._4_4_;
        auVar117._8_4_ = auVar50._8_4_ * fStack_1228;
        auVar117._12_4_ = auVar50._12_4_ * fStack_1224;
        auVar50 = vsubps_avx512vl(auVar113,auVar156._0_16_);
        auVar129._0_4_ = auVar50._0_4_ * local_11f0;
        auVar129._4_4_ = auVar50._4_4_ * fStack_11ec;
        auVar129._8_4_ = auVar50._8_4_ * fStack_11e8;
        auVar129._12_4_ = auVar50._12_4_ * fStack_11e4;
        auVar52 = vsubps_avx512vl(auVar52,auVar157._0_16_);
        auVar136._0_4_ = auVar52._0_4_ * local_1200;
        auVar136._4_4_ = auVar52._4_4_ * fStack_11fc;
        auVar136._8_4_ = auVar52._8_4_ * fStack_11f8;
        auVar136._12_4_ = auVar52._12_4_ * fStack_11f4;
        auVar50 = vpminsd_avx(auVar60,auVar117);
        auVar52 = vpmaxsd_avx(auVar60,auVar117);
        auVar51 = vpminsd_avx(auVar61,auVar129);
        auVar50 = vpmaxsd_avx(auVar50,auVar51);
        auVar51 = vpmaxsd_avx(auVar61,auVar129);
        auVar61 = vpminsd_avx(auVar52,auVar51);
        auVar51 = vpminsd_avx(auVar124,auVar136);
        auVar52 = vpmaxsd_avx(auVar124,auVar136);
        auVar33._4_4_ = iStack_120c;
        auVar33._0_4_ = local_1210;
        auVar33._8_4_ = iStack_1208;
        auVar33._12_4_ = iStack_1204;
        auVar51 = vpmaxsd_avx(auVar51,auVar33);
        local_11b0 = vpmaxsd_avx(auVar50,auVar51);
        auVar30._4_4_ = iStack_136c;
        auVar30._0_4_ = local_1370;
        auVar30._8_4_ = iStack_1368;
        auVar30._12_4_ = iStack_1364;
        auVar52 = vpminsd_avx(auVar52,auVar30);
        auVar52 = vpminsd_avx(auVar61,auVar52);
        local_12b8 = vpcmpd_avx512vl(local_11b0,auVar52,2);
        local_12b8 = ((byte)uVar21 & 0xf) & local_12b8;
        if ((char)local_12b8 != '\0') {
          local_13a0 = local_13a0 + local_1380;
          do {
            pRVar36 = local_12d8;
            sVar35 = local_12e0;
            lVar24 = 0;
            for (uVar39 = local_12b8; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000)
            {
              lVar24 = lVar24 + 1;
            }
            fVar118 = *(float *)(ray + k * 4 + 0x80);
            if (*(float *)(local_11b0 + lVar24 * 4) <= fVar118) {
              uVar9 = *(ushort *)(local_13a0 + lVar24 * 8);
              local_1384 = (uint)uVar9;
              uVar10 = *(ushort *)(local_13a0 + 2 + lVar24 * 8);
              uVar48 = *(uint *)(local_13a0 + 0x88);
              local_1398 = (ulong)uVar48;
              uVar11 = *(uint *)(local_13a0 + 4 + lVar24 * 8);
              local_1378 = (ulong)uVar11;
              local_12c0 = context->scene;
              pGVar12 = (local_12c0->geometries).items[local_1398].ptr;
              local_12c8 = *(long *)&pGVar12->field_0x58;
              fVar112 = (pGVar12->time_range).lower;
              auVar109._4_4_ = fVar112;
              auVar109._0_4_ = fVar112;
              auVar109._8_4_ = fVar112;
              auVar109._12_4_ = fVar112;
              fVar49 = pGVar12->fnumTimeSegments;
              auVar52 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar109);
              fVar112 = (pGVar12->time_range).upper - fVar112;
              auVar110._4_4_ = fVar112;
              auVar110._0_4_ = fVar112;
              auVar110._8_4_ = fVar112;
              auVar110._12_4_ = fVar112;
              auVar52 = vdivps_avx(auVar52,auVar110);
              auVar111._0_4_ = fVar49 * auVar52._0_4_;
              auVar111._4_4_ = fVar49 * auVar52._4_4_;
              auVar111._8_4_ = fVar49 * auVar52._8_4_;
              auVar111._12_4_ = fVar49 * auVar52._12_4_;
              auVar52 = vroundps_avx(auVar111,1);
              fVar49 = fVar49 + -1.0;
              auVar125._4_4_ = fVar49;
              auVar125._0_4_ = fVar49;
              auVar125._8_4_ = fVar49;
              auVar125._12_4_ = fVar49;
              auVar52 = vminps_avx(auVar52,auVar125);
              auVar52 = vmaxps_avx(auVar52,_DAT_01feba10);
              local_1190 = vsubps_avx(auVar111,auVar52);
              local_11a0 = vcvtps2dq_avx(auVar52);
              local_12d0 = pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_1378;
              local_1388 = local_1384 & 0x7fff;
              local_138c = uVar10 & 0x7fff;
              uVar41 = *(uint *)(local_12c8 + 4 + local_12d0);
              uVar44 = (ulong)uVar41;
              uVar43 = (ulong)(uVar41 * local_138c + *(int *)(local_12c8 + local_12d0) + local_1388)
              ;
              lVar13 = *(long *)&pGVar12[2].numPrimitives;
              lVar45 = (long)*(int *)(local_11a0 + k * 4) * 0x38;
              lVar14 = *(long *)(lVar13 + 0x10 + lVar45);
              lVar15 = *(long *)(lVar13 + lVar45);
              auVar52 = *(undefined1 (*) [16])(lVar15 + lVar14 * uVar43);
              lVar16 = *(long *)(lVar13 + 0x48 + lVar45);
              auVar50 = *(undefined1 (*) [16])(lVar15 + (uVar43 + 1) * lVar14);
              lVar24 = uVar43 + uVar44;
              auVar51 = *(undefined1 (*) [16])(lVar15 + lVar24 * lVar14);
              lVar46 = uVar43 + uVar44 + 1;
              auVar61 = *(undefined1 (*) [16])(lVar15 + lVar46 * lVar14);
              uVar39 = (ulong)(-1 < (short)uVar9);
              lVar40 = uVar43 + uVar39 + 1;
              auVar113 = *(undefined1 (*) [16])(lVar15 + lVar40 * lVar14);
              lVar42 = uVar39 + lVar46;
              auVar119 = *(undefined1 (*) [16])(lVar15 + lVar42 * lVar14);
              uVar39 = 0;
              if (-1 < (short)uVar10) {
                uVar39 = uVar44;
              }
              auVar60 = *(undefined1 (*) [16])(lVar15 + (lVar24 + uVar39) * lVar14);
              auVar126 = *(undefined1 (*) [16])(lVar15 + (lVar46 + uVar39) * lVar14);
              auVar70 = *(undefined1 (*) [16])(lVar15 + lVar14 * (uVar39 + lVar42));
              lVar13 = *(long *)(lVar13 + 0x38 + lVar45);
              auVar62 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(local_1190 + local_12e0 * 4)));
              auVar63 = vsubps_avx(*(undefined1 (*) [16])(lVar13 + lVar16 * uVar43),auVar52);
              auVar63 = vfmadd213ps_avx512vl(auVar63,auVar62,auVar52);
              auVar52 = vsubps_avx(*(undefined1 (*) [16])(lVar13 + lVar16 * (uVar43 + 1)),auVar50);
              auVar64 = vfmadd213ps_avx512vl(auVar52,auVar62,auVar50);
              auVar52 = vsubps_avx(*(undefined1 (*) [16])(lVar13 + lVar16 * lVar24),auVar51);
              auVar65 = vfmadd213ps_avx512vl(auVar52,auVar62,auVar51);
              auVar52 = vsubps_avx(*(undefined1 (*) [16])(lVar13 + lVar16 * lVar46),auVar61);
              auVar66 = vfmadd213ps_avx512vl(auVar52,auVar62,auVar61);
              auVar52 = vsubps_avx(*(undefined1 (*) [16])(lVar13 + lVar16 * lVar40),auVar113);
              auVar50 = vfmadd213ps_avx512vl(auVar52,auVar62,auVar113);
              auVar52 = vsubps_avx(*(undefined1 (*) [16])(lVar13 + lVar16 * lVar42),auVar119);
              auVar67 = vfmadd213ps_avx512vl(auVar52,auVar62,auVar119);
              auVar52 = vsubps_avx512vl(*(undefined1 (*) [16])(lVar13 + lVar16 * (lVar24 + uVar39)),
                                        auVar60);
              auVar68 = vfmadd213ps_avx512vl(auVar52,auVar62,auVar60);
              auVar52 = vsubps_avx512vl(*(undefined1 (*) [16])(lVar13 + lVar16 * (lVar46 + uVar39)),
                                        auVar126);
              auVar69 = vfmadd213ps_avx512vl(auVar52,auVar62,auVar126);
              auVar52 = vsubps_avx512vl(*(undefined1 (*) [16])(lVar13 + (uVar39 + lVar42) * lVar16),
                                        auVar70);
              auVar70 = vfmadd213ps_avx512vl(auVar52,auVar62,auVar70);
              auVar51 = vunpcklps_avx(auVar64,auVar67);
              auVar52 = vunpckhps_avx(auVar64,auVar67);
              auVar61 = vunpcklps_avx(auVar50,auVar66);
              auVar50 = vunpckhps_avx(auVar50,auVar66);
              auVar113 = vunpcklps_avx(auVar52,auVar50);
              auVar119 = vunpcklps_avx(auVar51,auVar61);
              auVar52 = vunpckhps_avx(auVar51,auVar61);
              auVar61 = vunpcklps_avx(auVar65,auVar69);
              auVar50 = vunpckhps_avx(auVar65,auVar69);
              auVar60 = vunpcklps_avx(auVar66,auVar68);
              auVar51 = vunpckhps_avx(auVar66,auVar68);
              auVar51 = vunpcklps_avx(auVar50,auVar51);
              auVar126 = vunpcklps_avx(auVar61,auVar60);
              auVar50 = vunpckhps_avx(auVar61,auVar60);
              auVar75._16_16_ = auVar69;
              auVar75._0_16_ = auVar65;
              auVar74._16_16_ = auVar67;
              auVar74._0_16_ = auVar64;
              auVar94 = vunpcklps_avx(auVar74,auVar75);
              auVar83._16_16_ = auVar66;
              auVar83._0_16_ = auVar63;
              auVar76._16_16_ = auVar70;
              auVar76._0_16_ = auVar66;
              auVar93 = vunpcklps_avx(auVar83,auVar76);
              auVar78 = vunpcklps_avx(auVar93,auVar94);
              auVar93 = vunpckhps_avx(auVar93,auVar94);
              auVar94 = vunpckhps_avx(auVar74,auVar75);
              auVar77 = vunpckhps_avx(auVar83,auVar76);
              auVar77 = vunpcklps_avx(auVar77,auVar94);
              auVar80._16_16_ = auVar119;
              auVar80._0_16_ = auVar119;
              auVar81._16_16_ = auVar52;
              auVar81._0_16_ = auVar52;
              auVar82._16_16_ = auVar113;
              auVar82._0_16_ = auVar113;
              auVar84._16_16_ = auVar126;
              auVar84._0_16_ = auVar126;
              auVar85._16_16_ = auVar50;
              auVar85._0_16_ = auVar50;
              local_1120 = &local_13a9;
              uVar7 = *(undefined4 *)(local_12d8 + local_12e0 * 4);
              auVar86._4_4_ = uVar7;
              auVar86._0_4_ = uVar7;
              auVar86._8_4_ = uVar7;
              auVar86._12_4_ = uVar7;
              auVar86._16_4_ = uVar7;
              auVar86._20_4_ = uVar7;
              auVar86._24_4_ = uVar7;
              auVar86._28_4_ = uVar7;
              auVar72 = vbroadcastss_avx512vl
                                  (ZEXT416(*(uint *)(local_12d8 + local_12e0 * 4 + 0x10)));
              auVar73 = vbroadcastss_avx512vl
                                  (ZEXT416(*(uint *)(local_12d8 + local_12e0 * 4 + 0x20)));
              uVar7 = *(undefined4 *)(local_12d8 + local_12e0 * 4 + 0x40);
              auVar146._4_4_ = uVar7;
              auVar146._0_4_ = uVar7;
              auVar146._8_4_ = uVar7;
              auVar146._12_4_ = uVar7;
              auVar146._16_4_ = uVar7;
              auVar146._20_4_ = uVar7;
              auVar146._24_4_ = uVar7;
              auVar146._28_4_ = uVar7;
              auVar74 = vinsertf32x4_avx512vl(ZEXT1632(auVar51),auVar51,1);
              uVar7 = *(undefined4 *)(local_12d8 + local_12e0 * 4 + 0x50);
              auVar152._4_4_ = uVar7;
              auVar152._0_4_ = uVar7;
              auVar152._8_4_ = uVar7;
              auVar152._12_4_ = uVar7;
              auVar152._16_4_ = uVar7;
              auVar152._20_4_ = uVar7;
              auVar152._24_4_ = uVar7;
              auVar152._28_4_ = uVar7;
              fVar112 = *(float *)(local_12d8 + local_12e0 * 4 + 0x60);
              auVar154._4_4_ = fVar112;
              auVar154._0_4_ = fVar112;
              auVar154._8_4_ = fVar112;
              auVar154._12_4_ = fVar112;
              auVar154._16_4_ = fVar112;
              auVar154._20_4_ = fVar112;
              auVar154._24_4_ = fVar112;
              auVar154._28_4_ = fVar112;
              auVar94 = vsubps_avx(auVar78,auVar86);
              auVar75 = vsubps_avx512vl(auVar93,auVar72);
              auVar76 = vsubps_avx512vl(auVar77,auVar73);
              auVar93 = vsubps_avx(auVar80,auVar86);
              auVar77 = vsubps_avx512vl(auVar81,auVar72);
              auVar78 = vsubps_avx512vl(auVar82,auVar73);
              auVar79 = vsubps_avx512vl(auVar84,auVar86);
              auVar80 = vsubps_avx512vl(auVar85,auVar72);
              auVar73 = vsubps_avx512vl(auVar74,auVar73);
              auVar74 = vsubps_avx512vl(auVar79,auVar94);
              auVar81 = vsubps_avx512vl(auVar80,auVar75);
              auVar82 = vsubps_avx512vl(auVar73,auVar76);
              auVar83 = vsubps_avx512vl(auVar94,auVar93);
              auVar84 = vsubps_avx512vl(auVar75,auVar77);
              auVar85 = vsubps_avx512vl(auVar76,auVar78);
              auVar86 = vsubps_avx512vl(auVar93,auVar79);
              auVar87 = vsubps_avx512vl(auVar77,auVar80);
              auVar88 = vsubps_avx512vl(auVar78,auVar73);
              auVar72 = vaddps_avx512vl(auVar79,auVar94);
              auVar89 = vaddps_avx512vl(auVar80,auVar75);
              auVar90 = vaddps_avx512vl(auVar73,auVar76);
              auVar91 = vmulps_avx512vl(auVar89,auVar82);
              auVar91 = vfmsub231ps_avx512vl(auVar91,auVar81,auVar90);
              auVar90 = vmulps_avx512vl(auVar90,auVar74);
              auVar90 = vfmsub231ps_avx512vl(auVar90,auVar82,auVar72);
              auVar72 = vmulps_avx512vl(auVar72,auVar81);
              auVar52 = vfmsub231ps_fma(auVar72,auVar74,auVar89);
              auVar89._0_4_ = auVar52._0_4_ * fVar112;
              auVar89._4_4_ = auVar52._4_4_ * fVar112;
              auVar89._8_4_ = auVar52._8_4_ * fVar112;
              auVar89._12_4_ = auVar52._12_4_ * fVar112;
              auVar89._16_4_ = fVar112 * 0.0;
              auVar89._20_4_ = fVar112 * 0.0;
              auVar89._24_4_ = fVar112 * 0.0;
              auVar89._28_4_ = 0;
              auVar72 = vfmadd231ps_avx512vl(auVar89,auVar152,auVar90);
              auVar89 = vfmadd231ps_avx512vl(auVar72,auVar146,auVar91);
              auVar92._0_4_ = auVar94._0_4_ + auVar93._0_4_;
              auVar92._4_4_ = auVar94._4_4_ + auVar93._4_4_;
              auVar92._8_4_ = auVar94._8_4_ + auVar93._8_4_;
              auVar92._12_4_ = auVar94._12_4_ + auVar93._12_4_;
              auVar92._16_4_ = auVar94._16_4_ + auVar93._16_4_;
              auVar92._20_4_ = auVar94._20_4_ + auVar93._20_4_;
              auVar92._24_4_ = auVar94._24_4_ + auVar93._24_4_;
              auVar92._28_4_ = auVar94._28_4_ + auVar93._28_4_;
              auVar72 = vaddps_avx512vl(auVar75,auVar77);
              auVar90 = vaddps_avx512vl(auVar76,auVar78);
              auVar91 = vmulps_avx512vl(auVar72,auVar85);
              auVar91 = vfmsub231ps_avx512vl(auVar91,auVar84,auVar90);
              auVar90 = vmulps_avx512vl(auVar90,auVar83);
              auVar90 = vfmsub231ps_avx512vl(auVar90,auVar85,auVar92);
              auVar92 = vmulps_avx512vl(auVar92,auVar84);
              auVar92 = vfmsub231ps_avx512vl(auVar92,auVar83,auVar72);
              auVar72._4_4_ = auVar92._4_4_ * fVar112;
              auVar72._0_4_ = auVar92._0_4_ * fVar112;
              auVar72._8_4_ = auVar92._8_4_ * fVar112;
              auVar72._12_4_ = auVar92._12_4_ * fVar112;
              auVar72._16_4_ = auVar92._16_4_ * fVar112;
              auVar72._20_4_ = auVar92._20_4_ * fVar112;
              auVar72._24_4_ = auVar92._24_4_ * fVar112;
              auVar72._28_4_ = auVar92._28_4_;
              auVar72 = vfmadd231ps_avx512vl(auVar72,auVar152,auVar90);
              auVar72 = vfmadd231ps_avx512vl(auVar72,auVar146,auVar91);
              auVar93 = vaddps_avx512vl(auVar93,auVar79);
              auVar77 = vaddps_avx512vl(auVar77,auVar80);
              auVar78 = vaddps_avx512vl(auVar78,auVar73);
              auVar73 = vmulps_avx512vl(auVar77,auVar88);
              auVar79 = vfmsub231ps_avx512vl(auVar73,auVar87,auVar78);
              auVar78 = vmulps_avx512vl(auVar78,auVar86);
              auVar78 = vfmsub231ps_avx512vl(auVar78,auVar88,auVar93);
              auVar73._4_4_ = auVar93._4_4_ * auVar87._4_4_;
              auVar73._0_4_ = auVar93._0_4_ * auVar87._0_4_;
              auVar73._8_4_ = auVar93._8_4_ * auVar87._8_4_;
              auVar73._12_4_ = auVar93._12_4_ * auVar87._12_4_;
              auVar73._16_4_ = auVar93._16_4_ * auVar87._16_4_;
              auVar73._20_4_ = auVar93._20_4_ * auVar87._20_4_;
              auVar73._24_4_ = auVar93._24_4_ * auVar87._24_4_;
              auVar73._28_4_ = auVar93._28_4_;
              auVar52 = vfmsub231ps_fma(auVar73,auVar86,auVar77);
              auVar93 = vmulps_avx512vl(ZEXT1632(auVar52),auVar154);
              auVar93 = vfmadd231ps_avx512vl(auVar93,auVar152,auVar78);
              auVar73 = vfmadd231ps_avx512vl(auVar93,auVar146,auVar79);
              auVar79._0_4_ = auVar89._0_4_ + auVar72._0_4_;
              auVar79._4_4_ = auVar89._4_4_ + auVar72._4_4_;
              auVar79._8_4_ = auVar89._8_4_ + auVar72._8_4_;
              auVar79._12_4_ = auVar89._12_4_ + auVar72._12_4_;
              auVar79._16_4_ = auVar89._16_4_ + auVar72._16_4_;
              auVar79._20_4_ = auVar89._20_4_ + auVar72._20_4_;
              auVar79._24_4_ = auVar89._24_4_ + auVar72._24_4_;
              auVar79._28_4_ = auVar89._28_4_ + auVar72._28_4_;
              local_1140 = vaddps_avx512vl(auVar73,auVar79);
              auVar93._8_4_ = 0x7fffffff;
              auVar93._0_8_ = 0x7fffffff7fffffff;
              auVar93._12_4_ = 0x7fffffff;
              auVar93._16_4_ = 0x7fffffff;
              auVar93._20_4_ = 0x7fffffff;
              auVar93._24_4_ = 0x7fffffff;
              auVar93._28_4_ = 0x7fffffff;
              vandps_avx512vl(local_1140,auVar93);
              auVar77._8_4_ = 0x34000000;
              auVar77._0_8_ = 0x3400000034000000;
              auVar77._12_4_ = 0x34000000;
              auVar77._16_4_ = 0x34000000;
              auVar77._20_4_ = 0x34000000;
              auVar77._24_4_ = 0x34000000;
              auVar77._28_4_ = 0x34000000;
              auVar93 = vmulps_avx512vl(local_1140,auVar77);
              auVar77 = vminps_avx512vl(auVar89,auVar72);
              auVar77 = vminps_avx512vl(auVar77,auVar73);
              auVar78._8_4_ = 0x80000000;
              auVar78._0_8_ = 0x8000000080000000;
              auVar78._12_4_ = 0x80000000;
              auVar78._16_4_ = 0x80000000;
              auVar78._20_4_ = 0x80000000;
              auVar78._24_4_ = 0x80000000;
              auVar78._28_4_ = 0x80000000;
              auVar78 = vxorps_avx512vl(auVar93,auVar78);
              uVar21 = vcmpps_avx512vl(auVar77,auVar78,5);
              auVar77 = vmaxps_avx512vl(auVar89,auVar72);
              auVar77 = vmaxps_avx512vl(auVar77,auVar73);
              uVar22 = vcmpps_avx512vl(auVar77,auVar93,2);
              bVar47 = (byte)uVar21 | (byte)uVar22;
              ray = pRVar36;
              k = sVar35;
              if (bVar47 != 0) {
                auVar93 = vmulps_avx512vl(auVar84,auVar82);
                auVar77 = vmulps_avx512vl(auVar74,auVar85);
                auVar78 = vmulps_avx512vl(auVar83,auVar81);
                auVar73 = vmulps_avx512vl(auVar87,auVar85);
                auVar79 = vmulps_avx512vl(auVar83,auVar88);
                auVar80 = vmulps_avx512vl(auVar86,auVar84);
                auVar81 = vfmsub213ps_avx512vl(auVar81,auVar85,auVar93);
                auVar82 = vfmsub213ps_avx512vl(auVar82,auVar83,auVar77);
                auVar74 = vfmsub213ps_avx512vl(auVar74,auVar84,auVar78);
                auVar84 = vfmsub213ps_avx512vl(auVar88,auVar84,auVar73);
                auVar85 = vfmsub213ps_avx512vl(auVar86,auVar85,auVar79);
                auVar83 = vfmsub213ps_avx512vl(auVar87,auVar83,auVar80);
                auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                vandps_avx512vl(auVar93,auVar86);
                vandps_avx512vl(auVar73,auVar86);
                uVar39 = vcmpps_avx512vl(auVar86,auVar86,1);
                vandps_avx512vl(auVar77,auVar86);
                vandps_avx512vl(auVar79,auVar86);
                uVar43 = vcmpps_avx512vl(auVar86,auVar86,1);
                vandps_avx512vl(auVar78,auVar86);
                vandps_avx512vl(auVar80,auVar86);
                uVar44 = vcmpps_avx512vl(auVar86,auVar86,1);
                bVar20 = (bool)((byte)uVar39 & 1);
                auVar90._0_4_ =
                     (float)((uint)bVar20 * auVar81._0_4_ | (uint)!bVar20 * auVar84._0_4_);
                bVar20 = (bool)((byte)(uVar39 >> 1) & 1);
                auVar90._4_4_ =
                     (float)((uint)bVar20 * auVar81._4_4_ | (uint)!bVar20 * auVar84._4_4_);
                bVar20 = (bool)((byte)(uVar39 >> 2) & 1);
                auVar90._8_4_ =
                     (float)((uint)bVar20 * auVar81._8_4_ | (uint)!bVar20 * auVar84._8_4_);
                bVar20 = (bool)((byte)(uVar39 >> 3) & 1);
                auVar90._12_4_ =
                     (float)((uint)bVar20 * auVar81._12_4_ | (uint)!bVar20 * auVar84._12_4_);
                bVar20 = (bool)((byte)(uVar39 >> 4) & 1);
                auVar90._16_4_ =
                     (float)((uint)bVar20 * auVar81._16_4_ | (uint)!bVar20 * auVar84._16_4_);
                bVar20 = (bool)((byte)(uVar39 >> 5) & 1);
                auVar90._20_4_ =
                     (float)((uint)bVar20 * auVar81._20_4_ | (uint)!bVar20 * auVar84._20_4_);
                bVar20 = (bool)((byte)(uVar39 >> 6) & 1);
                auVar90._24_4_ =
                     (float)((uint)bVar20 * auVar81._24_4_ | (uint)!bVar20 * auVar84._24_4_);
                bVar20 = SUB81(uVar39 >> 7,0);
                auVar90._28_4_ = (uint)bVar20 * auVar81._28_4_ | (uint)!bVar20 * auVar84._28_4_;
                bVar20 = (bool)((byte)uVar43 & 1);
                auVar91._0_4_ =
                     (float)((uint)bVar20 * auVar82._0_4_ | (uint)!bVar20 * auVar85._0_4_);
                bVar20 = (bool)((byte)(uVar43 >> 1) & 1);
                auVar91._4_4_ =
                     (float)((uint)bVar20 * auVar82._4_4_ | (uint)!bVar20 * auVar85._4_4_);
                bVar20 = (bool)((byte)(uVar43 >> 2) & 1);
                auVar91._8_4_ =
                     (float)((uint)bVar20 * auVar82._8_4_ | (uint)!bVar20 * auVar85._8_4_);
                bVar20 = (bool)((byte)(uVar43 >> 3) & 1);
                auVar91._12_4_ =
                     (float)((uint)bVar20 * auVar82._12_4_ | (uint)!bVar20 * auVar85._12_4_);
                bVar20 = (bool)((byte)(uVar43 >> 4) & 1);
                auVar91._16_4_ =
                     (float)((uint)bVar20 * auVar82._16_4_ | (uint)!bVar20 * auVar85._16_4_);
                bVar20 = (bool)((byte)(uVar43 >> 5) & 1);
                auVar91._20_4_ =
                     (float)((uint)bVar20 * auVar82._20_4_ | (uint)!bVar20 * auVar85._20_4_);
                bVar20 = (bool)((byte)(uVar43 >> 6) & 1);
                auVar91._24_4_ =
                     (float)((uint)bVar20 * auVar82._24_4_ | (uint)!bVar20 * auVar85._24_4_);
                bVar20 = SUB81(uVar43 >> 7,0);
                auVar91._28_4_ = (uint)bVar20 * auVar82._28_4_ | (uint)!bVar20 * auVar85._28_4_;
                bVar20 = (bool)((byte)uVar44 & 1);
                fVar49 = (float)((uint)bVar20 * auVar74._0_4_ | (uint)!bVar20 * auVar83._0_4_);
                bVar20 = (bool)((byte)(uVar44 >> 1) & 1);
                fVar97 = (float)((uint)bVar20 * auVar74._4_4_ | (uint)!bVar20 * auVar83._4_4_);
                bVar20 = (bool)((byte)(uVar44 >> 2) & 1);
                fVar98 = (float)((uint)bVar20 * auVar74._8_4_ | (uint)!bVar20 * auVar83._8_4_);
                bVar20 = (bool)((byte)(uVar44 >> 3) & 1);
                fVar99 = (float)((uint)bVar20 * auVar74._12_4_ | (uint)!bVar20 * auVar83._12_4_);
                bVar20 = (bool)((byte)(uVar44 >> 4) & 1);
                fVar100 = (float)((uint)bVar20 * auVar74._16_4_ | (uint)!bVar20 * auVar83._16_4_);
                bVar20 = (bool)((byte)(uVar44 >> 5) & 1);
                fVar101 = (float)((uint)bVar20 * auVar74._20_4_ | (uint)!bVar20 * auVar83._20_4_);
                bVar20 = (bool)((byte)(uVar44 >> 6) & 1);
                fVar102 = (float)((uint)bVar20 * auVar74._24_4_ | (uint)!bVar20 * auVar83._24_4_);
                bVar20 = SUB81(uVar44 >> 7,0);
                auVar88._4_4_ = fVar112 * fVar97;
                auVar88._0_4_ = fVar112 * fVar49;
                auVar88._8_4_ = fVar112 * fVar98;
                auVar88._12_4_ = fVar112 * fVar99;
                auVar88._16_4_ = fVar112 * fVar100;
                auVar88._20_4_ = fVar112 * fVar101;
                auVar88._24_4_ = fVar112 * fVar102;
                auVar88._28_4_ = fVar112;
                auVar52 = vfmadd213ps_fma(auVar152,auVar91,auVar88);
                auVar52 = vfmadd213ps_fma(auVar146,auVar90,ZEXT1632(auVar52));
                auVar77 = ZEXT1632(CONCAT412(auVar52._12_4_ + auVar52._12_4_,
                                             CONCAT48(auVar52._8_4_ + auVar52._8_4_,
                                                      CONCAT44(auVar52._4_4_ + auVar52._4_4_,
                                                               auVar52._0_4_ + auVar52._0_4_))));
                auVar153._0_4_ = auVar76._0_4_ * fVar49;
                auVar153._4_4_ = auVar76._4_4_ * fVar97;
                auVar153._8_4_ = auVar76._8_4_ * fVar98;
                auVar153._12_4_ = auVar76._12_4_ * fVar99;
                auVar153._16_4_ = auVar76._16_4_ * fVar100;
                auVar153._20_4_ = auVar76._20_4_ * fVar101;
                auVar153._24_4_ = auVar76._24_4_ * fVar102;
                auVar153._28_4_ = 0;
                auVar52 = vfmadd213ps_fma(auVar75,auVar91,auVar153);
                auVar50 = vfmadd213ps_fma(auVar94,auVar90,ZEXT1632(auVar52));
                auVar93 = vrcp14ps_avx512vl(auVar77);
                auVar94._8_4_ = 0x3f800000;
                auVar94._0_8_ = &DAT_3f8000003f800000;
                auVar94._12_4_ = 0x3f800000;
                auVar94._16_4_ = 0x3f800000;
                auVar94._20_4_ = 0x3f800000;
                auVar94._24_4_ = 0x3f800000;
                auVar94._28_4_ = 0x3f800000;
                auVar94 = vfnmadd213ps_avx512vl(auVar93,auVar77,auVar94);
                auVar52 = vfmadd132ps_fma(auVar94,auVar93,auVar93);
                local_11e0 = ZEXT1632(CONCAT412(auVar52._12_4_ * (auVar50._12_4_ + auVar50._12_4_),
                                                CONCAT48(auVar52._8_4_ *
                                                         (auVar50._8_4_ + auVar50._8_4_),
                                                         CONCAT44(auVar52._4_4_ *
                                                                  (auVar50._4_4_ + auVar50._4_4_),
                                                                  auVar52._0_4_ *
                                                                  (auVar50._0_4_ + auVar50._0_4_))))
                                     );
                auVar104._4_4_ = fVar118;
                auVar104._0_4_ = fVar118;
                auVar104._8_4_ = fVar118;
                auVar104._12_4_ = fVar118;
                auVar104._16_4_ = fVar118;
                auVar104._20_4_ = fVar118;
                auVar104._24_4_ = fVar118;
                auVar104._28_4_ = fVar118;
                uVar21 = vcmpps_avx512vl(local_11e0,auVar104,2);
                uVar7 = *(undefined4 *)(local_12d8 + local_12e0 * 4 + 0x30);
                auVar87._4_4_ = uVar7;
                auVar87._0_4_ = uVar7;
                auVar87._8_4_ = uVar7;
                auVar87._12_4_ = uVar7;
                auVar87._16_4_ = uVar7;
                auVar87._20_4_ = uVar7;
                auVar87._24_4_ = uVar7;
                auVar87._28_4_ = uVar7;
                uVar22 = vcmpps_avx512vl(local_11e0,auVar87,0xd);
                bVar47 = (byte)uVar21 & (byte)uVar22 & bVar47;
                if (bVar47 != 0) {
                  uVar21 = vcmpps_avx512vl(auVar77,_DAT_02020f00,4);
                  bVar47 = bVar47 & (byte)uVar21;
                  if (bVar47 != 0) {
                    local_1120 = &local_13a9;
                    local_1118 = CONCAT31(local_1118._1_3_,bVar47);
                    local_10c0 = local_11e0;
                    auVar94 = vsubps_avx(local_1140,auVar72);
                    auVar94 = vblendps_avx(auVar89,auVar94,0xf0);
                    auVar93 = vsubps_avx(local_1140,auVar89);
                    auVar93 = vblendps_avx(auVar72,auVar93,0xf0);
                    local_10a0[0] = auVar90._0_4_ * 1.0;
                    local_10a0[1] = auVar90._4_4_ * 1.0;
                    local_10a0[2] = auVar90._8_4_ * 1.0;
                    local_10a0[3] = auVar90._12_4_ * 1.0;
                    fStack_1090 = auVar90._16_4_ * -1.0;
                    fStack_108c = auVar90._20_4_ * -1.0;
                    fStack_1088 = auVar90._24_4_ * -1.0;
                    uStack_1084 = auVar90._28_4_;
                    local_1080._4_4_ = auVar91._4_4_ * 1.0;
                    local_1080._0_4_ = auVar91._0_4_ * 1.0;
                    local_1080._8_4_ = auVar91._8_4_ * 1.0;
                    local_1080._12_4_ = auVar91._12_4_ * 1.0;
                    local_1080._16_4_ = auVar91._16_4_ * -1.0;
                    local_1080._20_4_ = auVar91._20_4_ * -1.0;
                    local_1080._24_4_ = auVar91._24_4_ * -1.0;
                    local_1080._28_4_ = auVar91._28_4_;
                    local_1060[0] = fVar49 * 1.0;
                    local_1060[1] = fVar97 * 1.0;
                    local_1060[2] = fVar98 * 1.0;
                    local_1060[3] = fVar99 * 1.0;
                    fStack_1050 = fVar100 * -1.0;
                    fStack_104c = fVar101 * -1.0;
                    fStack_1048 = fVar102 * -1.0;
                    uStack_1044 = (uint)bVar20 * auVar74._28_4_ | (uint)!bVar20 * auVar83._28_4_;
                    auVar77 = vpbroadcastd_avx512vl();
                    auVar77 = vpaddd_avx2(auVar77,_DAT_0205d4c0);
                    auVar78 = vpbroadcastd_avx512vl();
                    auVar78 = vpaddd_avx2(auVar78,_DAT_0205d4e0);
                    auVar130._0_4_ = (float)(int)(*(ushort *)(local_12c8 + 8 + local_12d0) - 1);
                    auVar130._4_12_ = auVar76._4_12_;
                    auVar29._12_4_ = 0;
                    auVar29._0_12_ = ZEXT812(0);
                    auVar50 = vrcp14ss_avx512f(auVar29 << 0x20,ZEXT416((uint)auVar130._0_4_));
                    auVar52 = vfnmadd213ss_fma(auVar130,auVar50,SUB6416(ZEXT464(0x40000000),0));
                    fVar118 = auVar50._0_4_ * auVar52._0_4_;
                    auVar145._0_4_ = (float)(int)(*(ushort *)(local_12c8 + 10 + local_12d0) - 1);
                    auVar145._4_12_ = auVar76._4_12_;
                    auVar50 = vrcp14ss_avx512f(auVar29 << 0x20,ZEXT416((uint)auVar145._0_4_));
                    auVar52 = vfnmadd213ss_fma(auVar145,auVar50,SUB6416(ZEXT464(0x40000000),0));
                    fStack_1148 = auVar50._0_4_ * auVar52._0_4_;
                    auVar77 = vcvtdq2ps_avx(auVar77);
                    fVar101 = auVar77._28_4_ + auVar94._28_4_;
                    fVar112 = (local_1140._0_4_ * auVar77._0_4_ + auVar94._0_4_) * fVar118;
                    fVar49 = (local_1140._4_4_ * auVar77._4_4_ + auVar94._4_4_) * fVar118;
                    local_1180._4_4_ = fVar49;
                    local_1180._0_4_ = fVar112;
                    fVar97 = (local_1140._8_4_ * auVar77._8_4_ + auVar94._8_4_) * fVar118;
                    local_1180._8_4_ = fVar97;
                    fVar98 = (local_1140._12_4_ * auVar77._12_4_ + auVar94._12_4_) * fVar118;
                    local_1180._12_4_ = fVar98;
                    fVar99 = (local_1140._16_4_ * auVar77._16_4_ + auVar94._16_4_) * fVar118;
                    local_1180._16_4_ = fVar99;
                    fVar100 = (local_1140._20_4_ * auVar77._20_4_ + auVar94._20_4_) * fVar118;
                    local_1180._20_4_ = fVar100;
                    fVar118 = (local_1140._24_4_ * auVar77._24_4_ + auVar94._24_4_) * fVar118;
                    local_1180._24_4_ = fVar118;
                    local_1180._28_4_ = fVar101;
                    auVar94 = vcvtdq2ps_avx(auVar78);
                    fStack_1144 = auVar94._28_4_ + auVar93._28_4_;
                    local_1160 = (local_1140._0_4_ * auVar94._0_4_ + auVar93._0_4_) * fStack_1148;
                    fStack_115c = (local_1140._4_4_ * auVar94._4_4_ + auVar93._4_4_) * fStack_1148;
                    fStack_1158 = (local_1140._8_4_ * auVar94._8_4_ + auVar93._8_4_) * fStack_1148;
                    fStack_1154 = (local_1140._12_4_ * auVar94._12_4_ + auVar93._12_4_) *
                                  fStack_1148;
                    fStack_1150 = (local_1140._16_4_ * auVar94._16_4_ + auVar93._16_4_) *
                                  fStack_1148;
                    fStack_114c = (local_1140._20_4_ * auVar94._20_4_ + auVar93._20_4_) *
                                  fStack_1148;
                    fStack_1148 = (local_1140._24_4_ * auVar94._24_4_ + auVar93._24_4_) *
                                  fStack_1148;
                    pGVar12 = (local_12c0->geometries).items[local_1398].ptr;
                    if ((pGVar12->mask & *(uint *)(local_12d8 + local_12e0 * 4 + 0x90)) != 0) {
                      auVar25._8_4_ = 0x219392ef;
                      auVar25._0_8_ = 0x219392ef219392ef;
                      auVar25._12_4_ = 0x219392ef;
                      auVar25._16_4_ = 0x219392ef;
                      auVar25._20_4_ = 0x219392ef;
                      auVar25._24_4_ = 0x219392ef;
                      auVar25._28_4_ = 0x219392ef;
                      uVar39 = vcmpps_avx512vl(local_1140,auVar25,5);
                      auVar94 = vrcp14ps_avx512vl(local_1140);
                      auVar131._8_4_ = 0x3f800000;
                      auVar131._0_8_ = &DAT_3f8000003f800000;
                      auVar131._12_4_ = 0x3f800000;
                      auVar131._16_4_ = 0x3f800000;
                      auVar131._20_4_ = 0x3f800000;
                      auVar131._24_4_ = 0x3f800000;
                      auVar131._28_4_ = 0x3f800000;
                      auVar52 = vfnmadd213ps_fma(local_1140,auVar94,auVar131);
                      auVar94 = vfmadd132ps_avx512vl(ZEXT1632(auVar52),auVar94,auVar94);
                      fVar1 = (float)((uint)((byte)uVar39 & 1) * auVar94._0_4_);
                      fVar102 = (float)((uint)((byte)(uVar39 >> 1) & 1) * auVar94._4_4_);
                      fVar2 = (float)((uint)((byte)(uVar39 >> 2) & 1) * auVar94._8_4_);
                      fVar3 = (float)((uint)((byte)(uVar39 >> 3) & 1) * auVar94._12_4_);
                      fVar4 = (float)((uint)((byte)(uVar39 >> 4) & 1) * auVar94._16_4_);
                      fVar5 = (float)((uint)((byte)(uVar39 >> 5) & 1) * auVar94._20_4_);
                      fVar6 = (float)((uint)((byte)(uVar39 >> 6) & 1) * auVar94._24_4_);
                      auVar27._4_4_ = fVar49 * fVar102;
                      auVar27._0_4_ = fVar112 * fVar1;
                      auVar27._8_4_ = fVar97 * fVar2;
                      auVar27._12_4_ = fVar98 * fVar3;
                      auVar27._16_4_ = fVar99 * fVar4;
                      auVar27._20_4_ = fVar100 * fVar5;
                      auVar27._24_4_ = fVar118 * fVar6;
                      auVar27._28_4_ = fVar101;
                      local_1100 = vminps_avx(auVar27,auVar131);
                      auVar28._4_4_ = fStack_115c * fVar102;
                      auVar28._0_4_ = local_1160 * fVar1;
                      auVar28._8_4_ = fStack_1158 * fVar2;
                      auVar28._12_4_ = fStack_1154 * fVar3;
                      auVar28._16_4_ = fStack_1150 * fVar4;
                      auVar28._20_4_ = fStack_114c * fVar5;
                      auVar28._24_4_ = fStack_1148 * fVar6;
                      auVar28._28_4_ = fStack_1144;
                      local_10e0 = vminps_avx(auVar28,auVar131);
                      auVar137 = ZEXT3264(local_11e0);
                      auVar105._8_4_ = 0x7f800000;
                      auVar105._0_8_ = 0x7f8000007f800000;
                      auVar105._12_4_ = 0x7f800000;
                      auVar105._16_4_ = 0x7f800000;
                      auVar105._20_4_ = 0x7f800000;
                      auVar105._24_4_ = 0x7f800000;
                      auVar105._28_4_ = 0x7f800000;
                      auVar94 = vblendmps_avx512vl(auVar105,local_11e0);
                      auVar95._0_4_ =
                           (uint)(bVar47 & 1) * auVar94._0_4_ |
                           (uint)!(bool)(bVar47 & 1) * 0x7f800000;
                      bVar20 = (bool)((byte)(local_1118 >> 1) & 1);
                      auVar95._4_4_ = (uint)bVar20 * auVar94._4_4_ | (uint)!bVar20 * 0x7f800000;
                      bVar20 = (bool)((byte)(local_1118 >> 2) & 1);
                      auVar95._8_4_ = (uint)bVar20 * auVar94._8_4_ | (uint)!bVar20 * 0x7f800000;
                      bVar20 = (bool)((byte)(local_1118 >> 3) & 1);
                      auVar95._12_4_ = (uint)bVar20 * auVar94._12_4_ | (uint)!bVar20 * 0x7f800000;
                      bVar20 = (bool)((byte)(local_1118 >> 4) & 1);
                      auVar95._16_4_ = (uint)bVar20 * auVar94._16_4_ | (uint)!bVar20 * 0x7f800000;
                      bVar20 = (bool)((byte)(local_1118 >> 5) & 1);
                      auVar95._20_4_ = (uint)bVar20 * auVar94._20_4_ | (uint)!bVar20 * 0x7f800000;
                      bVar20 = (bool)((byte)(local_1118 >> 6) & 1);
                      auVar95._24_4_ = (uint)bVar20 * auVar94._24_4_ | (uint)!bVar20 * 0x7f800000;
                      bVar20 = (bool)((byte)(local_1118 >> 7) & 1);
                      auVar95._28_4_ = (uint)bVar20 * auVar94._28_4_ | (uint)!bVar20 * 0x7f800000;
                      auVar94 = vshufps_avx(auVar95,auVar95,0xb1);
                      auVar94 = vminps_avx(auVar95,auVar94);
                      auVar93 = vshufpd_avx(auVar94,auVar94,5);
                      auVar94 = vminps_avx(auVar94,auVar93);
                      auVar93 = vpermpd_avx2(auVar94,0x4e);
                      auVar94 = vminps_avx(auVar94,auVar93);
                      uVar21 = vcmpps_avx512vl(auVar95,auVar94,0);
                      bVar47 = (byte)uVar21 & bVar47;
                      uVar41 = (uint)bVar47;
                      if (bVar47 == 0) {
                        uVar41 = local_1118;
                      }
                      uVar39 = 0;
                      for (uVar43 = (ulong)(uVar41 & 0xff); (uVar43 & 1) == 0;
                          uVar43 = uVar43 >> 1 | 0x8000000000000000) {
                        uVar39 = uVar39 + 1;
                      }
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        uVar7 = *(undefined4 *)(local_1100 + uVar39 * 4);
                        uVar8 = *(undefined4 *)(local_10e0 + uVar39 * 4);
                        fVar118 = local_10a0[uVar39];
                        fVar112 = local_1060[uVar39 - 8];
                        fVar49 = local_1060[uVar39];
                        *(float *)(local_12d8 + local_12e0 * 4 + 0x80) = local_10a0[uVar39 - 8];
                        *(float *)(local_12d8 + local_12e0 * 4 + 0xc0) = fVar118;
                        *(float *)(local_12d8 + local_12e0 * 4 + 0xd0) = fVar112;
                        *(float *)(local_12d8 + local_12e0 * 4 + 0xe0) = fVar49;
                        *(undefined4 *)(local_12d8 + local_12e0 * 4 + 0xf0) = uVar7;
                        *(undefined4 *)(local_12d8 + local_12e0 * 4 + 0x100) = uVar8;
                        *(uint *)(local_12d8 + local_12e0 * 4 + 0x110) = uVar11;
                        *(uint *)(local_12d8 + local_12e0 * 4 + 0x120) = uVar48;
                        *(uint *)(local_12d8 + local_12e0 * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(local_12d8 + local_12e0 * 4 + 0x140) =
                             context->user->instPrimID[0];
                      }
                      else {
                        local_1350 = vpbroadcastd_avx512vl();
                        local_1360 = vpbroadcastd_avx512vl();
                        uVar48 = local_1118;
                        do {
                          local_1398 = CONCAT44(local_1398._4_4_,
                                                *(undefined4 *)(pRVar36 + sVar35 * 4 + 0x80));
                          uVar7 = *(undefined4 *)(local_1100 + uVar39 * 4);
                          local_1000._4_4_ = uVar7;
                          local_1000._0_4_ = uVar7;
                          local_1000._8_4_ = uVar7;
                          local_1000._12_4_ = uVar7;
                          uVar7 = *(undefined4 *)(local_10e0 + uVar39 * 4);
                          local_ff0._4_4_ = uVar7;
                          local_ff0._0_4_ = uVar7;
                          local_ff0._8_4_ = uVar7;
                          local_ff0._12_4_ = uVar7;
                          *(float *)(pRVar36 + sVar35 * 4 + 0x80) = local_10a0[uVar39 - 8];
                          local_12b0.context = context->user;
                          local_1030 = local_10a0[uVar39];
                          fVar118 = local_1060[uVar39 - 8];
                          local_1020._4_4_ = fVar118;
                          local_1020._0_4_ = fVar118;
                          local_1020._8_4_ = fVar118;
                          local_1020._12_4_ = fVar118;
                          fVar118 = local_1060[uVar39];
                          local_1010._4_4_ = fVar118;
                          local_1010._0_4_ = fVar118;
                          local_1010._8_4_ = fVar118;
                          local_1010._12_4_ = fVar118;
                          fStack_102c = local_1030;
                          fStack_1028 = local_1030;
                          fStack_1024 = local_1030;
                          local_fe0 = local_1360._0_8_;
                          uStack_fd8 = local_1360._8_8_;
                          local_fd0 = local_1350;
                          vpcmpeqd_avx2(ZEXT1632(local_1350),ZEXT1632(local_1350));
                          uStack_fbc = (local_12b0.context)->instID[0];
                          local_fc0 = uStack_fbc;
                          uStack_fb8 = uStack_fbc;
                          uStack_fb4 = uStack_fbc;
                          uStack_fb0 = (local_12b0.context)->instPrimID[0];
                          uStack_fac = uStack_fb0;
                          uStack_fa8 = uStack_fb0;
                          uStack_fa4 = uStack_fb0;
                          local_1340 = local_11c0._0_8_;
                          uStack_1338 = local_11c0._8_8_;
                          local_12b0.valid = (int *)&local_1340;
                          local_12b0.geometryUserPtr = pGVar12->userPtr;
                          local_12b0.ray = (RTCRayN *)pRVar36;
                          local_12b0.hit = (RTCHitN *)&local_1030;
                          local_12b0.N = 4;
                          if (pGVar12->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar12->intersectionFilterN)(&local_12b0);
                            auVar137 = ZEXT3264(local_11e0);
                            auVar159 = ZEXT1664(local_1280);
                            auVar158 = ZEXT1664(local_1270);
                            auVar157 = ZEXT1664(local_1260);
                            auVar156 = ZEXT1664(local_1250);
                            auVar155 = ZEXT1664(local_1240);
                          }
                          auVar31._8_8_ = uStack_1338;
                          auVar31._0_8_ = local_1340;
                          uVar43 = vptestmd_avx512vl(auVar31,auVar31);
                          if ((uVar43 & 0xf) == 0) {
LAB_0079816a:
                            *(undefined4 *)(pRVar36 + sVar35 * 4 + 0x80) = (undefined4)local_1398;
                          }
                          else {
                            p_Var17 = context->args->filter;
                            if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var17)(&local_12b0);
                              auVar137 = ZEXT3264(local_11e0);
                              auVar159 = ZEXT1664(local_1280);
                              auVar158 = ZEXT1664(local_1270);
                              auVar157 = ZEXT1664(local_1260);
                              auVar156 = ZEXT1664(local_1250);
                              auVar155 = ZEXT1664(local_1240);
                            }
                            auVar32._8_8_ = uStack_1338;
                            auVar32._0_8_ = local_1340;
                            uVar43 = vptestmd_avx512vl(auVar32,auVar32);
                            uVar43 = uVar43 & 0xf;
                            bVar47 = (byte)uVar43;
                            if (bVar47 == 0) goto LAB_0079816a;
                            fVar118 = *(float *)(local_12b0.hit + 4);
                            fVar112 = *(float *)(local_12b0.hit + 8);
                            fVar49 = *(float *)(local_12b0.hit + 0xc);
                            bVar20 = (bool)((byte)(uVar43 >> 1) & 1);
                            bVar18 = (bool)((byte)(uVar43 >> 2) & 1);
                            bVar19 = SUB81(uVar43 >> 3,0);
                            *(uint *)(local_12b0.ray + 0xc0) =
                                 (uint)(bVar47 & 1) * (int)*(float *)local_12b0.hit |
                                 (uint)!(bool)(bVar47 & 1) * *(int *)(local_12b0.ray + 0xc0);
                            *(uint *)(local_12b0.ray + 0xc4) =
                                 (uint)bVar20 * (int)fVar118 |
                                 (uint)!bVar20 * *(int *)(local_12b0.ray + 0xc4);
                            *(uint *)(local_12b0.ray + 200) =
                                 (uint)bVar18 * (int)fVar112 |
                                 (uint)!bVar18 * *(int *)(local_12b0.ray + 200);
                            *(uint *)(local_12b0.ray + 0xcc) =
                                 (uint)bVar19 * (int)fVar49 |
                                 (uint)!bVar19 * *(int *)(local_12b0.ray + 0xcc);
                            fVar118 = *(float *)(local_12b0.hit + 0x14);
                            fVar112 = *(float *)(local_12b0.hit + 0x18);
                            fVar49 = *(float *)(local_12b0.hit + 0x1c);
                            bVar20 = (bool)((byte)(uVar43 >> 1) & 1);
                            bVar18 = (bool)((byte)(uVar43 >> 2) & 1);
                            bVar19 = SUB81(uVar43 >> 3,0);
                            *(uint *)(local_12b0.ray + 0xd0) =
                                 (uint)(bVar47 & 1) * (int)*(float *)(local_12b0.hit + 0x10) |
                                 (uint)!(bool)(bVar47 & 1) * *(int *)(local_12b0.ray + 0xd0);
                            *(uint *)(local_12b0.ray + 0xd4) =
                                 (uint)bVar20 * (int)fVar118 |
                                 (uint)!bVar20 * *(int *)(local_12b0.ray + 0xd4);
                            *(uint *)(local_12b0.ray + 0xd8) =
                                 (uint)bVar18 * (int)fVar112 |
                                 (uint)!bVar18 * *(int *)(local_12b0.ray + 0xd8);
                            *(uint *)(local_12b0.ray + 0xdc) =
                                 (uint)bVar19 * (int)fVar49 |
                                 (uint)!bVar19 * *(int *)(local_12b0.ray + 0xdc);
                            fVar118 = *(float *)(local_12b0.hit + 0x24);
                            fVar112 = *(float *)(local_12b0.hit + 0x28);
                            fVar49 = *(float *)(local_12b0.hit + 0x2c);
                            bVar20 = (bool)((byte)(uVar43 >> 1) & 1);
                            bVar18 = (bool)((byte)(uVar43 >> 2) & 1);
                            bVar19 = SUB81(uVar43 >> 3,0);
                            *(uint *)(local_12b0.ray + 0xe0) =
                                 (uint)(bVar47 & 1) * (int)*(float *)(local_12b0.hit + 0x20) |
                                 (uint)!(bool)(bVar47 & 1) * *(int *)(local_12b0.ray + 0xe0);
                            *(uint *)(local_12b0.ray + 0xe4) =
                                 (uint)bVar20 * (int)fVar118 |
                                 (uint)!bVar20 * *(int *)(local_12b0.ray + 0xe4);
                            *(uint *)(local_12b0.ray + 0xe8) =
                                 (uint)bVar18 * (int)fVar112 |
                                 (uint)!bVar18 * *(int *)(local_12b0.ray + 0xe8);
                            *(uint *)(local_12b0.ray + 0xec) =
                                 (uint)bVar19 * (int)fVar49 |
                                 (uint)!bVar19 * *(int *)(local_12b0.ray + 0xec);
                            fVar118 = *(float *)(local_12b0.hit + 0x34);
                            fVar112 = *(float *)(local_12b0.hit + 0x38);
                            fVar49 = *(float *)(local_12b0.hit + 0x3c);
                            bVar20 = (bool)((byte)(uVar43 >> 1) & 1);
                            bVar18 = (bool)((byte)(uVar43 >> 2) & 1);
                            bVar19 = SUB81(uVar43 >> 3,0);
                            *(uint *)(local_12b0.ray + 0xf0) =
                                 (uint)(bVar47 & 1) * (int)*(float *)(local_12b0.hit + 0x30) |
                                 (uint)!(bool)(bVar47 & 1) * *(int *)(local_12b0.ray + 0xf0);
                            *(uint *)(local_12b0.ray + 0xf4) =
                                 (uint)bVar20 * (int)fVar118 |
                                 (uint)!bVar20 * *(int *)(local_12b0.ray + 0xf4);
                            *(uint *)(local_12b0.ray + 0xf8) =
                                 (uint)bVar18 * (int)fVar112 |
                                 (uint)!bVar18 * *(int *)(local_12b0.ray + 0xf8);
                            *(uint *)(local_12b0.ray + 0xfc) =
                                 (uint)bVar19 * (int)fVar49 |
                                 (uint)!bVar19 * *(int *)(local_12b0.ray + 0xfc);
                            auVar52 = *(undefined1 (*) [16])(local_12b0.ray + 0x100);
                            auVar71._0_4_ =
                                 (uint)(bVar47 & 1) * (int)*(float *)(local_12b0.hit + 0x40) |
                                 (uint)!(bool)(bVar47 & 1) * auVar52._0_4_;
                            bVar20 = (bool)((byte)(uVar43 >> 1) & 1);
                            auVar71._4_4_ =
                                 (uint)bVar20 * (int)*(float *)(local_12b0.hit + 0x44) |
                                 (uint)!bVar20 * auVar52._4_4_;
                            bVar20 = (bool)((byte)(uVar43 >> 2) & 1);
                            auVar71._8_4_ =
                                 (uint)bVar20 * (int)*(float *)(local_12b0.hit + 0x48) |
                                 (uint)!bVar20 * auVar52._8_4_;
                            bVar20 = SUB81(uVar43 >> 3,0);
                            auVar71._12_4_ =
                                 (uint)bVar20 * (int)*(float *)(local_12b0.hit + 0x4c) |
                                 (uint)!bVar20 * auVar52._12_4_;
                            *(undefined1 (*) [16])(local_12b0.ray + 0x100) = auVar71;
                            auVar52 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_12b0.hit + 0x50));
                            *(undefined1 (*) [16])(local_12b0.ray + 0x110) = auVar52;
                            auVar52 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_12b0.hit + 0x60));
                            *(undefined1 (*) [16])(local_12b0.ray + 0x120) = auVar52;
                            auVar52 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_12b0.hit + 0x70));
                            *(undefined1 (*) [16])(local_12b0.ray + 0x130) = auVar52;
                            auVar52 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_12b0.hit + 0x80));
                            *(undefined1 (*) [16])(local_12b0.ray + 0x140) = auVar52;
                          }
                          bVar23 = ~(byte)(1 << ((uint)uVar39 & 0x1f)) & (byte)uVar48;
                          uVar7 = *(undefined4 *)(pRVar36 + sVar35 * 4 + 0x80);
                          auVar26._4_4_ = uVar7;
                          auVar26._0_4_ = uVar7;
                          auVar26._8_4_ = uVar7;
                          auVar26._12_4_ = uVar7;
                          auVar26._16_4_ = uVar7;
                          auVar26._20_4_ = uVar7;
                          auVar26._24_4_ = uVar7;
                          auVar26._28_4_ = uVar7;
                          uVar21 = vcmpps_avx512vl(auVar137._0_32_,auVar26,2);
                          bVar47 = bVar23 & (byte)uVar21;
                          uVar48 = (uint)bVar47;
                          if ((bVar23 & (byte)uVar21) != 0) {
                            auVar106._8_4_ = 0x7f800000;
                            auVar106._0_8_ = 0x7f8000007f800000;
                            auVar106._12_4_ = 0x7f800000;
                            auVar106._16_4_ = 0x7f800000;
                            auVar106._20_4_ = 0x7f800000;
                            auVar106._24_4_ = 0x7f800000;
                            auVar106._28_4_ = 0x7f800000;
                            auVar94 = vblendmps_avx512vl(auVar106,auVar137._0_32_);
                            auVar96._0_4_ =
                                 (uint)(bVar47 & 1) * auVar94._0_4_ |
                                 (uint)!(bool)(bVar47 & 1) * 0x7f800000;
                            bVar20 = (bool)(bVar47 >> 1 & 1);
                            auVar96._4_4_ =
                                 (uint)bVar20 * auVar94._4_4_ | (uint)!bVar20 * 0x7f800000;
                            bVar20 = (bool)(bVar47 >> 2 & 1);
                            auVar96._8_4_ =
                                 (uint)bVar20 * auVar94._8_4_ | (uint)!bVar20 * 0x7f800000;
                            bVar20 = (bool)(bVar47 >> 3 & 1);
                            auVar96._12_4_ =
                                 (uint)bVar20 * auVar94._12_4_ | (uint)!bVar20 * 0x7f800000;
                            bVar20 = (bool)(bVar47 >> 4 & 1);
                            auVar96._16_4_ =
                                 (uint)bVar20 * auVar94._16_4_ | (uint)!bVar20 * 0x7f800000;
                            bVar20 = (bool)(bVar47 >> 5 & 1);
                            auVar96._20_4_ =
                                 (uint)bVar20 * auVar94._20_4_ | (uint)!bVar20 * 0x7f800000;
                            bVar20 = (bool)(bVar47 >> 6 & 1);
                            auVar96._24_4_ =
                                 (uint)bVar20 * auVar94._24_4_ | (uint)!bVar20 * 0x7f800000;
                            auVar96._28_4_ =
                                 (uint)(bVar47 >> 7) * auVar94._28_4_ |
                                 (uint)!(bool)(bVar47 >> 7) * 0x7f800000;
                            auVar94 = vshufps_avx(auVar96,auVar96,0xb1);
                            auVar94 = vminps_avx(auVar96,auVar94);
                            auVar93 = vshufpd_avx(auVar94,auVar94,5);
                            auVar94 = vminps_avx(auVar94,auVar93);
                            auVar93 = vpermpd_avx2(auVar94,0x4e);
                            auVar94 = vminps_avx(auVar94,auVar93);
                            uVar21 = vcmpps_avx512vl(auVar96,auVar94,0);
                            bVar37 = (byte)uVar21 & bVar47;
                            bVar23 = bVar47;
                            if (bVar37 != 0) {
                              bVar23 = bVar37;
                            }
                            uVar11 = 0;
                            for (uVar41 = (uint)bVar23; (uVar41 & 1) == 0;
                                uVar41 = uVar41 >> 1 | 0x80000000) {
                              uVar11 = uVar11 + 1;
                            }
                            uVar39 = (ulong)uVar11;
                          }
                        } while (bVar47 != 0);
                      }
                    }
                  }
                }
              }
            }
            local_12b8 = local_12b8 - 1 & local_12b8;
          } while (local_12b8 != 0);
        }
        local_12f0 = local_12f0 + 1;
      } while (local_12f0 != local_1328);
    }
    iStack_1364 = *(int *)(ray + k * 4 + 0x80);
    auVar141 = ZEXT1664(_local_1220);
    auVar137 = ZEXT1664(_local_1230);
    iStack_1368 = iStack_1364;
    iStack_136c = iStack_1364;
    local_1370 = iStack_1364;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }